

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

CBString * __thiscall Bstrlib::CBString::operator=(CBString *this,uchar c)

{
  uint uVar1;
  uchar *puVar2;
  CBStringException *pCVar3;
  allocator local_81;
  CBStringException bstr__cppwrapper_exception;
  string local_58;
  string local_38;
  
  uVar1 = (this->super_tagbstring).mlen;
  if ((int)uVar1 < 1) {
    std::__cxx11::string::string((string *)&local_38,"CBString::Write protection error",&local_81);
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar3,&bstr__cppwrapper_exception);
    __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  if (uVar1 < 3) {
    alloc(this,2);
  }
  puVar2 = (this->super_tagbstring).data;
  if (puVar2 != (uchar *)0x0) {
    (this->super_tagbstring).slen = 1;
    *puVar2 = c;
    (this->super_tagbstring).data[1] = '\0';
    return this;
  }
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  std::__cxx11::string::string
            ((string *)&local_58,"CBString::Failure in =(char) operator",&local_81);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar3,&bstr__cppwrapper_exception);
  __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

const CBString& CBString::operator = (unsigned char c) {
	if (mlen <= 0) bstringThrow ("Write protection error");
	if (2 >= mlen) alloc (2);
	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in =(char) operator");
	} else {
		slen = 1;
		data[0] = c;
		data[1] = '\0';
	}
	return *this;
}